

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perfect.hpp
# Opt level: O2

void __thiscall
Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>::Perfect
          (Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> *this,FuncTerm *elem)

{
  bool local_58 [8];
  undefined8 uStack_50;
  undefined8 local_48;
  FuncTerm *local_38;
  undefined4 *local_30;
  uint local_28 [2];
  FuncTerm *local_20;
  
  local_38 = elem;
  Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
  ::tryGet((Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
            *)&local_30,(FuncTerm **)Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>::_ids);
  if (local_30 == (undefined4 *)0x0) {
    local_58[0] = false;
    local_58[1] = false;
    local_58[2] = false;
    local_58[3] = false;
    local_58[4] = false;
    local_58[5] = false;
    local_58[6] = false;
    local_58[7] = false;
    uStack_50 = 0;
    local_48 = 0;
  }
  else {
    local_48 = *(undefined8 *)(local_30 + 2);
    uStack_50 = CONCAT44(uStack_50._4_4_,*local_30);
  }
  local_58[0] = local_30 != (undefined4 *)0x0;
  Option<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>>::
  unwrapOrElse<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>::unwrapOrElse(Kernel::FuncTerm)::_lambda()_1_>
            ((Option<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>> *)local_28,
             (FuncTerm *)local_58);
  this->_id = local_28[0];
  this->_ptr = local_20;
  return;
}

Assistant:

explicit Perfect(T elem) 
    : Perfect(_ids.tryGet(&elem).toOwned()
        .unwrapOrElse([&](){
            auto entry = Perfect(_ids.size(),  new T(std::move(elem)));
            _ids.insert(entry._ptr, entry);
            DEBUG(*elemPtr, " -> ", T::className(),"#",entry._id);
            return entry;
          })) 
    { }